

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadString(CodedInputStream *this,string *buffer,int size)

{
  int iVar1;
  char *__dest;
  int size_local;
  string *buffer_local;
  CodedInputStream *this_local;
  bool local_9;
  
  if (size < 0) {
    this_local._3_1_ = false;
  }
  else {
    if (size < 0) {
      local_9 = false;
    }
    else {
      iVar1 = BufferSize(this);
      if (iVar1 < size) {
        local_9 = ReadStringFallback(this,buffer,size);
      }
      else {
        STLStringResizeUninitialized(buffer,(long)size);
        if (0 < size) {
          __dest = string_as_array(buffer);
          memcpy(__dest,this->buffer_,(long)size);
          Advance(this,size);
        }
        local_9 = true;
      }
    }
    this_local._3_1_ = local_9;
  }
  return this_local._3_1_;
}

Assistant:

bool CodedInputStream::ReadString(string* buffer, int size) {
  if (size < 0) return false;  // security: size is often user-supplied
  return InternalReadStringInline(buffer, size);
}